

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

ParameterizedTestSuiteInfo<pickrst_test_lowbd::PixelProjErrorTest> * __thiscall
testing::internal::ParameterizedTestSuiteRegistry::
GetTestSuitePatternHolder<pickrst_test_lowbd::PixelProjErrorTest>
          (ParameterizedTestSuiteRegistry *this,char *test_suite_name,CodeLocation *code_location)

{
  pointer *pppPVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ppPVar3;
  pointer ppPVar4;
  pointer pcVar5;
  iterator __position;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ParameterizedTestSuiteInfo<pickrst_test_lowbd::PixelProjErrorTest> *this_00;
  pointer ppPVar8;
  ParameterizedTestSuiteInfo<pickrst_test_lowbd::PixelProjErrorTest> *local_88;
  CodeLocation local_80;
  CodeLocation local_58;
  
  ppPVar3 = (this->test_suite_infos_).
            super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppPVar4 = (this->test_suite_infos_).
            super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppPVar3 == ppPVar4) {
    this_00 = (ParameterizedTestSuiteInfo<pickrst_test_lowbd::PixelProjErrorTest> *)0x0;
  }
  else {
    this_00 = (ParameterizedTestSuiteInfo<pickrst_test_lowbd::PixelProjErrorTest> *)0x0;
    do {
      ppPVar8 = ppPVar3 + 1;
      iVar6 = (*(*ppPVar3)->_vptr_ParameterizedTestSuiteInfoBase[2])();
      iVar6 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var,iVar6));
      if (iVar6 == 0) {
        iVar7 = (*(*ppPVar3)->_vptr_ParameterizedTestSuiteInfoBase[3])();
        if ((undefined1 *)CONCAT44(extraout_var_00,iVar7) !=
            &TypeIdHelper<pickrst_test_lowbd::PixelProjErrorTest>::dummy_) {
          local_58.file._M_dataplus._M_p = (pointer)&local_58.file.field_2;
          pcVar5 = (code_location->file)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_58,pcVar5,pcVar5 + (code_location->file)._M_string_length);
          local_58.line = code_location->line;
          ReportInvalidTestSuiteType(test_suite_name,&local_58);
          CodeLocation::~CodeLocation(&local_58);
          posix::Abort();
        }
        this_00 = CheckedDowncastToActualType<testing::internal::ParameterizedTestSuiteInfo<pickrst_test_lowbd::PixelProjErrorTest>,testing::internal::ParameterizedTestSuiteInfoBase>
                            (*ppPVar3);
      }
    } while ((iVar6 != 0) && (ppPVar3 = ppPVar8, ppPVar8 != ppPVar4));
  }
  if (this_00 == (ParameterizedTestSuiteInfo<pickrst_test_lowbd::PixelProjErrorTest> *)0x0) {
    this_00 = (ParameterizedTestSuiteInfo<pickrst_test_lowbd::PixelProjErrorTest> *)
              operator_new(0x80);
    paVar2 = &local_80.file.field_2;
    pcVar5 = (code_location->file)._M_dataplus._M_p;
    local_80.file._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar5,pcVar5 + (code_location->file)._M_string_length);
    local_80.line = code_location->line;
    ParameterizedTestSuiteInfo<pickrst_test_lowbd::PixelProjErrorTest>::ParameterizedTestSuiteInfo
              (this_00,test_suite_name,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.file._M_dataplus._M_p != paVar2) {
      operator_delete(local_80.file._M_dataplus._M_p);
    }
    __position._M_current =
         (this->test_suite_infos_).
         super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->test_suite_infos_).
        super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_88 = this_00;
      std::
      vector<testing::internal::ParameterizedTestSuiteInfoBase*,std::allocator<testing::internal::ParameterizedTestSuiteInfoBase*>>
      ::_M_realloc_insert<testing::internal::ParameterizedTestSuiteInfoBase*>
                ((vector<testing::internal::ParameterizedTestSuiteInfoBase*,std::allocator<testing::internal::ParameterizedTestSuiteInfoBase*>>
                  *)this,__position,(ParameterizedTestSuiteInfoBase **)&local_88);
    }
    else {
      *__position._M_current = (ParameterizedTestSuiteInfoBase *)this_00;
      pppPVar1 = &(this->test_suite_infos_).
                  super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppPVar1 = *pppPVar1 + 1;
    }
  }
  return this_00;
}

Assistant:

ParameterizedTestSuiteInfo<TestSuite>* GetTestSuitePatternHolder(
      const char* test_suite_name, CodeLocation code_location) {
    ParameterizedTestSuiteInfo<TestSuite>* typed_test_info = nullptr;
    for (auto& test_suite_info : test_suite_infos_) {
      if (test_suite_info->GetTestSuiteName() == test_suite_name) {
        if (test_suite_info->GetTestSuiteTypeId() != GetTypeId<TestSuite>()) {
          // Complain about incorrect usage of Google Test facilities
          // and terminate the program since we cannot guaranty correct
          // test suite setup and tear-down in this case.
          ReportInvalidTestSuiteType(test_suite_name, code_location);
          posix::Abort();
        } else {
          // At this point we are sure that the object we found is of the same
          // type we are looking for, so we downcast it to that type
          // without further checks.
          typed_test_info = CheckedDowncastToActualType<
              ParameterizedTestSuiteInfo<TestSuite>>(test_suite_info);
        }
        break;
      }
    }
    if (typed_test_info == nullptr) {
      typed_test_info = new ParameterizedTestSuiteInfo<TestSuite>(
          test_suite_name, code_location);
      test_suite_infos_.push_back(typed_test_info);
    }
    return typed_test_info;
  }